

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_gains.hpp
# Opt level: O2

void __thiscall
ear::OutputGainMat::write_mat<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (OutputGainMat *this,Matrix<double,__1,__1,_0,__1,__1> *mat)

{
  Scalar *pSVar1;
  size_t row;
  ulong row_00;
  size_t col;
  ulong col_00;
  
  (**this->_vptr_OutputGainMat)
            (this,(mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                  m_rows,
             (mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols);
  for (col_00 = 0;
      col_00 < (ulong)(mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_cols; col_00 = col_00 + 1) {
    for (row_00 = 0;
        row_00 < (ulong)(mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_rows; row_00 = row_00 + 1) {
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)mat,row_00
                          ,col_00);
      (*this->_vptr_OutputGainMat[3])(*pSVar1,this,row_00,col_00);
    }
  }
  return;
}

Assistant:

void write_mat(T mat) {
      check_size(mat.rows(), mat.cols());
      for (size_t col = 0; col < (size_t)mat.cols(); col++)
        for (size_t row = 0; row < (size_t)mat.rows(); row++)
          write(row, col, mat(row, col));
    }